

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeSetCacheSize(Btree *p,int mxPage)

{
  BtShared *pBVar1;
  PCache *p_00;
  sqlite3_pcache *psVar2;
  _func_void_sqlite3_pcache_ptr_int *p_Var3;
  int iVar4;
  int extraout_EAX;
  
  pBVar1 = p->pBt;
  sqlite3BtreeEnter(p);
  p_00 = pBVar1->pPager->pPCache;
  p_00->szCache = mxPage;
  p_Var3 = sqlite3Config.pcache2.xCachesize;
  psVar2 = p_00->pCache;
  iVar4 = numberOfCachePages(p_00);
  (*p_Var3)(psVar2,iVar4);
  sqlite3BtreeLeave(p);
  return extraout_EAX;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeSetCacheSize(Btree *p, int mxPage){
  BtShared *pBt = p->pBt;
  assert( sqlite3_mutex_held(p->db->mutex) );
  sqlite3BtreeEnter(p);
  sqlite3PagerSetCachesize(pBt->pPager, mxPage);
  sqlite3BtreeLeave(p);
  return SQLITE_OK;
}